

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O1

char * stun_err_reason(int err_code)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  
  lVar1 = 8;
  pcVar3 = (char *)0x0;
  do {
    if (*(int *)(&UNK_0015f428 + lVar1) == err_code) {
      pcVar3 = *(char **)((long)&err_msg_map[0].err_code + lVar1);
      break;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x118);
  pcVar2 = "???";
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

const char *stun_err_reason(int err_code) {
  int i;
  const char *msg = NULL;
  for (i = 0; i < sizeof(err_msg_map) / sizeof(err_msg_map[0]); i++) {
    if (err_msg_map[i].err_code == err_code) {
      msg = err_msg_map[i].err_msg;
      break;
    }
  }
  /* Avoiding to return NULL for unknown codes */
  return (msg == NULL) ? "???" : msg;
}